

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_parameters.cpp
# Opt level: O0

int __thiscall cpp_db::sqlite_parameters::find_param_pos(sqlite_parameters *this,string *name)

{
  sqlite3_stmt *psVar1;
  char *pcVar2;
  db_exception *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  string *psStack_18;
  int pos;
  string *name_local;
  sqlite_parameters *this_local;
  
  psStack_18 = name;
  name_local = (string *)this;
  psVar1 = get_stmt_handle(this);
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (psStack_18);
  local_1c = sqlite3_bind_parameter_index(psVar1,pcVar2);
  if (local_1c != 0) {
    return local_1c;
  }
  this_00 = (db_exception *)__cxa_allocate_exception(0x10);
  std::operator+(&local_60,"Index for SQL parameter \'",psStack_18);
  std::operator+(&local_40,&local_60,"\' not found!");
  db_exception::db_exception(this_00,&local_40);
  __cxa_throw(this_00,&db_exception::typeinfo,db_exception::~db_exception);
}

Assistant:

int sqlite_parameters::find_param_pos(const std::string &name) const
{
	if (int pos = sqlite3_bind_parameter_index(get_stmt_handle(), name.c_str()))
        return pos;
    else
        throw db_exception("Index for SQL parameter '" + name + "' not found!");
}